

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O1

void __thiscall glslang::TIntermLoop::traverse(TIntermLoop *this,TIntermTraverser *it)

{
  pointer *pppTVar1;
  TIntermNode *pTVar2;
  int iVar3;
  char cVar4;
  TIntermTyped *pTVar5;
  
  cVar4 = '\x01';
  if (it->preVisit == true) {
    iVar3 = (*it->_vptr_TIntermTraverser[8])(it,0,this);
    cVar4 = (char)iVar3;
  }
  if (cVar4 != '\0') {
    TIntermTraverser::incrementDepth(it,&this->super_TIntermNode);
    if (it->rightToLeft == true) {
      pTVar5 = this->terminal;
      if (pTVar5 != (TIntermTyped *)0x0) {
        (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[2])(pTVar5,it);
      }
      pTVar2 = this->body;
      if (pTVar2 != (TIntermNode *)0x0) {
        (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
      }
      pTVar5 = this->test;
    }
    else {
      pTVar5 = this->test;
      if (pTVar5 != (TIntermTyped *)0x0) {
        (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[2])(pTVar5,it);
      }
      pTVar2 = this->body;
      if (pTVar2 != (TIntermNode *)0x0) {
        (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
      }
      pTVar5 = this->terminal;
    }
    if (pTVar5 != (TIntermTyped *)0x0) {
      (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[2])(pTVar5,it);
    }
    it->depth = it->depth + -1;
    pppTVar1 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + -1;
    if ((cVar4 != '\0') && (it->postVisit == true)) {
      (*it->_vptr_TIntermTraverser[8])(it,2,this);
      return;
    }
  }
  return;
}

Assistant:

void TIntermLoop::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitLoop(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);

        if (it->rightToLeft) {
            if (terminal)
                terminal->traverse(it);

            if (body)
                body->traverse(it);

            if (test)
                test->traverse(it);
        } else {
            if (test)
                test->traverse(it);

            if (body)
                body->traverse(it);

            if (terminal)
                terminal->traverse(it);
        }

        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitLoop(EvPostVisit, this);
}